

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLinearAllocator.hpp
# Opt level: O0

void __thiscall Diligent::DynamicLinearAllocator::Free(DynamicLinearAllocator *this)

{
  bool bVar1;
  reference pBVar2;
  Block *block;
  iterator __end2;
  iterator __begin2;
  vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  *__range2;
  DynamicLinearAllocator *this_local;
  
  __end2 = std::
           vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
           ::begin(&this->m_Blocks);
  block = (Block *)std::
                   vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
                   ::end(&this->m_Blocks);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Diligent::DynamicLinearAllocator::Block_*,_std::vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>_>
                                *)&block);
    if (!bVar1) break;
    pBVar2 = __gnu_cxx::
             __normal_iterator<Diligent::DynamicLinearAllocator::Block_*,_std::vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>_>
             ::operator*(&__end2);
    (*this->m_pAllocator->_vptr_IMemoryAllocator[1])(this->m_pAllocator,pBVar2->Data);
    __gnu_cxx::
    __normal_iterator<Diligent::DynamicLinearAllocator::Block_*,_std::vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ::clear(&this->m_Blocks);
  this->m_pAllocator = (IMemoryAllocator *)0x0;
  return;
}

Assistant:

void Free()
    {
        for (auto& block : m_Blocks)
        {
            m_pAllocator->Free(block.Data);
        }
        m_Blocks.clear();

        m_pAllocator = nullptr;
    }